

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void write_pixels(FILE *f,int rgb_dir,int vdir,int x,int y,int comp,void *data,int write_alpha,
                 int scanline_pad,int expand_mono)

{
  uchar *__ptr;
  uchar *d;
  int j_end;
  int k;
  int j;
  int i;
  stbiw_uint32 zero;
  undefined1 auStack_24 [2];
  uchar px [3];
  uchar bg [3];
  int comp_local;
  int y_local;
  int x_local;
  int vdir_local;
  int rgb_dir_local;
  FILE *f_local;
  
  stack0xffffffffffffffe0 = y;
  _auStack_24 = comp;
  zero._1_2_ = 0xff;
  zero._3_1_ = 0xff;
  j = 0;
  if (0 < y) {
    if (vdir < 0) {
      d._0_4_ = -1;
      j_end = y + -1;
    }
    else {
      j_end = 0;
      d._0_4_ = y;
    }
    for (; j_end != (int)d; j_end = vdir + j_end) {
      for (k = 0; k < x; k = k + 1) {
        __ptr = (uchar *)((long)data + (long)((j_end * x + k) * _auStack_24));
        if (write_alpha < 0) {
          fwrite(__ptr + (_auStack_24 + -1),1,1,(FILE *)f);
        }
        switch(_auStack_24) {
        case 1:
          fwrite(__ptr,1,1,(FILE *)f);
          break;
        case 2:
          if (expand_mono == 0) {
            fwrite(__ptr,1,1,(FILE *)f);
          }
          else {
            write3(f,*__ptr,*__ptr,*__ptr);
          }
          break;
        case 3:
switchD_00164ffe_caseD_3:
          write3(f,__ptr[1 - rgb_dir],__ptr[1],__ptr[rgb_dir + 1]);
          break;
        case 4:
          if (write_alpha != 0) goto switchD_00164ffe_caseD_3;
          for (d._4_4_ = 0; d._4_4_ < 3; d._4_4_ = d._4_4_ + 1) {
            *(char *)((long)&i + (long)d._4_4_ + 2) =
                 auStack_24[(long)d._4_4_ + -3] +
                 (char)((int)(((uint)__ptr[d._4_4_] - (uint)(byte)auStack_24[(long)d._4_4_ + -3]) *
                             (uint)__ptr[3]) / 0xff);
          }
          write3(f,*(uchar *)((long)&i + (long)(1 - rgb_dir) + 2),i._3_1_,
                 *(uchar *)((long)&i + (long)(rgb_dir + 1) + 2));
        }
        if (0 < write_alpha) {
          fwrite(__ptr + (_auStack_24 + -1),1,1,(FILE *)f);
        }
      }
      fwrite(&j,(long)scanline_pad,1,(FILE *)f);
    }
  }
  return;
}

Assistant:

static void write_pixels(FILE *f, int rgb_dir, int vdir, int x, int y, int comp, void *data, int write_alpha, int scanline_pad, int expand_mono)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   stbiw_uint32 zero = 0;
   int i,j,k, j_end;

   if (y <= 0)
      return;

   if (vdir < 0)
      j_end = -1, j = y-1;
   else
      j_end =  y, j = 0;

   for (; j != j_end; j += vdir) {
      for (i=0; i < x; ++i) {
         unsigned char *d = (unsigned char *) data + (j*x+i)*comp;
         if (write_alpha < 0)
            fwrite(&d[comp-1], 1, 1, f);
         switch (comp) {
            case 1: fwrite(d, 1, 1, f);
                    break;
            case 2: if (expand_mono)
                       write3(f, d[0],d[0],d[0]); // monochrome bmp
                    else
                       fwrite(d, 1, 1, f);  // monochrome TGA
                    break;
            case 4:
               if (!write_alpha) {
                  // composite against pink background
                  for (k=0; k < 3; ++k)
                     px[k] = bg[k] + ((d[k] - bg[k]) * d[3])/255;
                  write3(f, px[1-rgb_dir],px[1],px[1+rgb_dir]);
                  break;
               }
               /* FALLTHROUGH */
            case 3:
               write3(f, d[1-rgb_dir],d[1],d[1+rgb_dir]);
               break;
         }
         if (write_alpha > 0)
            fwrite(&d[comp-1], 1, 1, f);
      }
      fwrite(&zero,scanline_pad,1,f);
   }
}